

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createConvexHullShape
          (BulletEngine *this,aphy_scalar *coordinates,aphy_size num_points,aphy_size stride)

{
  ref<aphy::collision_shape> rVar1;
  collision_shape_ptr in_RAX;
  btConvexHullShape *this_00;
  ref<aphy::collision_shape> local_28;
  
  local_28.counter = in_RAX;
  this_00 = (btConvexHullShape *)btConvexHullShape::operator_new(0x98);
  btConvexHullShape::btConvexHullShape(this_00,coordinates,num_points,stride);
  aphy::
  makeObjectWithInterface<aphy::collision_shape,APhyBullet::BulletCollisionShape,btConvexHullShape*>
            ((aphy *)&local_28,this_00);
  rVar1.counter = local_28.counter;
  local_28.counter = (Counter *)0x0;
  aphy::ref<aphy::collision_shape>::~ref(&local_28);
  return rVar1.counter;
}

Assistant:

collision_shape_ptr BulletEngine::createConvexHullShape(aphy_scalar* coordinates, aphy_size num_points, aphy_size stride)
{
    return makeObject<BulletCollisionShape> (
        new btConvexHullShape(coordinates, num_points, stride)
    ).disown();
}